

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

int Ndr_TypeWlc2Ndr(int Type)

{
  undefined4 local_c;
  int Type_local;
  
  if (Type == 6) {
    local_c = 0x61;
  }
  else if (Type == 7) {
    local_c = 0xb;
  }
  else if (Type == 8) {
    local_c = 0x15;
  }
  else if (Type == 9) {
    local_c = 0x45;
  }
  else if (Type == 10) {
    local_c = 0x47;
  }
  else if (Type == 0xb) {
    local_c = 0x44;
  }
  else if (Type == 0xc) {
    local_c = 0x46;
  }
  else if (Type == 0xd) {
    local_c = 0x49;
  }
  else if (Type == 0xe) {
    local_c = 0x48;
  }
  else if (Type == 0xf) {
    local_c = 0xc;
  }
  else if (Type == 0x10) {
    local_c = 0xd;
  }
  else if (Type == 0x11) {
    local_c = 0xf;
  }
  else if (Type == 0x12) {
    local_c = 0x11;
  }
  else if (Type == 0x13) {
    local_c = 0xe;
  }
  else if (Type == 0x14) {
    local_c = 0x10;
  }
  else if (Type == 0x15) {
    local_c = 0x12;
  }
  else if (Type == 0x16) {
    local_c = 0x5b;
  }
  else if (Type == 0x17) {
    local_c = 0x5c;
  }
  else if (Type == 0x18) {
    local_c = 0x5d;
  }
  else if (Type == 0x19) {
    local_c = 0x5e;
  }
  else if (Type == 0x1a) {
    local_c = 0x24;
  }
  else if (Type == 0x1b) {
    local_c = 0x5f;
  }
  else if (Type == 0x1c) {
    local_c = 0x25;
  }
  else if (Type == 0x1d) {
    local_c = 0x27;
  }
  else if (Type == 0x1e) {
    local_c = 0x29;
  }
  else if (Type == 0x39) {
    local_c = 0x2c;
  }
  else if (Type == 0x3a) {
    local_c = 0x30;
  }
  else if (Type == 0x1f) {
    local_c = 0x42;
  }
  else if (Type == 0x20) {
    local_c = 0x43;
  }
  else if (Type == 0x21) {
    local_c = 0x3e;
  }
  else if (Type == 0x22) {
    local_c = 0x41;
  }
  else if (Type == 0x23) {
    local_c = 0x3f;
  }
  else if (Type == 0x24) {
    local_c = 0x40;
  }
  else if (Type == 0x25) {
    local_c = 0x1e;
  }
  else if (Type == 0x26) {
    local_c = 0x20;
  }
  else if (Type == 0x27) {
    local_c = 0x22;
  }
  else if (Type == 0x28) {
    local_c = 0x1f;
  }
  else if (Type == 0x29) {
    local_c = 0x21;
  }
  else if (Type == 0x2a) {
    local_c = 0x23;
  }
  else if (Type == 0x2b) {
    local_c = 0x32;
  }
  else if (Type == 0x2c) {
    local_c = 0x33;
  }
  else if (Type == 0x2d) {
    local_c = 0x34;
  }
  else if (Type == 0x2e) {
    local_c = 0x36;
  }
  else if (Type == 0x2f) {
    local_c = 0x38;
  }
  else if (Type == 0x30) {
    local_c = 0x37;
  }
  else if (Type == 0x31) {
    local_c = 0x39;
  }
  else if (Type == 0x32) {
    local_c = 0x3a;
  }
  else if (Type == 0x33) {
    local_c = 0x3b;
  }
  else if (Type == 0x34) {
    local_c = 0x60;
  }
  else if (Type == 0x38) {
    local_c = 0x62;
  }
  else if (Type == 0x2d) {
    local_c = 0x35;
  }
  else if (Type == 3) {
    local_c = 0x59;
  }
  else if (Type == 5) {
    local_c = 0x59;
  }
  else if (Type == 0x36) {
    local_c = 0x50;
  }
  else if (Type == 0x37) {
    local_c = 0x51;
  }
  else if (Type == 0x3b) {
    local_c = 0x4b;
  }
  else {
    local_c = -1;
  }
  return local_c;
}

Assistant:

int Ndr_TypeWlc2Ndr( int Type )
{
    if ( Type == WLC_OBJ_CONST )          return ABC_OPER_CONST;        // 06: constant
    if ( Type == WLC_OBJ_BUF )            return ABC_OPER_BIT_BUF;      // 07: buffer
    if ( Type == WLC_OBJ_MUX )            return ABC_OPER_BIT_MUX;      // 08: multiplexer
    if ( Type == WLC_OBJ_SHIFT_R )        return ABC_OPER_SHIFT_R;      // 09: shift right
    if ( Type == WLC_OBJ_SHIFT_RA )       return ABC_OPER_SHIFT_RA;     // 10: shift right (arithmetic)
    if ( Type == WLC_OBJ_SHIFT_L )        return ABC_OPER_SHIFT_L;      // 11: shift left
    if ( Type == WLC_OBJ_SHIFT_LA )       return ABC_OPER_SHIFT_LA;     // 12: shift left (arithmetic)
    if ( Type == WLC_OBJ_ROTATE_R )       return ABC_OPER_SHIFT_ROTR;   // 13: rotate right
    if ( Type == WLC_OBJ_ROTATE_L )       return ABC_OPER_SHIFT_ROTL;   // 14: rotate left
    if ( Type == WLC_OBJ_BIT_NOT )        return ABC_OPER_BIT_INV;      // 15: bitwise NOT
    if ( Type == WLC_OBJ_BIT_AND )        return ABC_OPER_BIT_AND;      // 16: bitwise AND
    if ( Type == WLC_OBJ_BIT_OR )         return ABC_OPER_BIT_OR;       // 17: bitwise OR
    if ( Type == WLC_OBJ_BIT_XOR )        return ABC_OPER_BIT_XOR;      // 18: bitwise XOR
    if ( Type == WLC_OBJ_BIT_NAND )       return ABC_OPER_BIT_NAND;     // 19: bitwise AND
    if ( Type == WLC_OBJ_BIT_NOR )        return ABC_OPER_BIT_NOR;      // 20: bitwise OR
    if ( Type == WLC_OBJ_BIT_NXOR )       return ABC_OPER_BIT_NXOR;     // 21: bitwise NXOR
    if ( Type == WLC_OBJ_BIT_SELECT )     return ABC_OPER_SLICE;        // 22: bit selection
    if ( Type == WLC_OBJ_BIT_CONCAT )     return ABC_OPER_CONCAT;       // 23: bit concatenation
    if ( Type == WLC_OBJ_BIT_ZEROPAD )    return ABC_OPER_ZEROPAD;      // 24: zero padding
    if ( Type == WLC_OBJ_BIT_SIGNEXT )    return ABC_OPER_SIGNEXT;      // 25: sign extension
    if ( Type == WLC_OBJ_LOGIC_NOT )      return ABC_OPER_LOGIC_NOT;    // 26: logic NOT
    if ( Type == WLC_OBJ_LOGIC_IMPL )     return ABC_OPER_LOGIC_IMPL;   // 27: logic implication
    if ( Type == WLC_OBJ_LOGIC_AND )      return ABC_OPER_LOGIC_AND;    // 28: logic AND
    if ( Type == WLC_OBJ_LOGIC_OR )       return ABC_OPER_LOGIC_OR;     // 29: logic OR
    if ( Type == WLC_OBJ_LOGIC_XOR )      return ABC_OPER_LOGIC_XOR;    // 30: logic XOR
    if ( Type == WLC_OBJ_SEL )            return ABC_OPER_SEL_SEL;      // 57: selector
    if ( Type == WLC_OBJ_DEC )            return ABC_OPER_SEL_DEC;      // 58: decoder
    if ( Type == WLC_OBJ_COMP_EQU )       return ABC_OPER_COMP_EQU;     // 31: compare equal
    if ( Type == WLC_OBJ_COMP_NOTEQU )    return ABC_OPER_COMP_NOTEQU;  // 32: compare not equal
    if ( Type == WLC_OBJ_COMP_LESS )      return ABC_OPER_COMP_LESS;    // 33: compare less
    if ( Type == WLC_OBJ_COMP_MORE )      return ABC_OPER_COMP_MORE;    // 34: compare more
    if ( Type == WLC_OBJ_COMP_LESSEQU )   return ABC_OPER_COMP_LESSEQU; // 35: compare less or equal
    if ( Type == WLC_OBJ_COMP_MOREEQU )   return ABC_OPER_COMP_MOREEQU; // 36: compare more or equal
    if ( Type == WLC_OBJ_REDUCT_AND )     return ABC_OPER_RED_AND;      // 37: reduction AND
    if ( Type == WLC_OBJ_REDUCT_OR )      return ABC_OPER_RED_OR;       // 38: reduction OR
    if ( Type == WLC_OBJ_REDUCT_XOR )     return ABC_OPER_RED_XOR;      // 39: reduction XOR
    if ( Type == WLC_OBJ_REDUCT_NAND )    return ABC_OPER_RED_NAND;     // 40: reduction NAND
    if ( Type == WLC_OBJ_REDUCT_NOR )     return ABC_OPER_RED_NOR;      // 41: reduction NOR
    if ( Type == WLC_OBJ_REDUCT_NXOR )    return ABC_OPER_RED_NXOR;     // 42: reduction NXOR
    if ( Type == WLC_OBJ_ARI_ADD )        return ABC_OPER_ARI_ADD;      // 43: arithmetic addition
    if ( Type == WLC_OBJ_ARI_SUB )        return ABC_OPER_ARI_SUB;      // 44: arithmetic subtraction
    if ( Type == WLC_OBJ_ARI_MULTI )      return ABC_OPER_ARI_MUL;      // 45: arithmetic multiplier
    if ( Type == WLC_OBJ_ARI_DIVIDE )     return ABC_OPER_ARI_DIV;      // 46: arithmetic division
    if ( Type == WLC_OBJ_ARI_REM )        return ABC_OPER_ARI_REM;      // 47: arithmetic remainder
    if ( Type == WLC_OBJ_ARI_MODULUS )    return ABC_OPER_ARI_MOD;      // 48: arithmetic modulus
    if ( Type == WLC_OBJ_ARI_POWER )      return ABC_OPER_ARI_POW;      // 49: arithmetic power
    if ( Type == WLC_OBJ_ARI_MINUS )      return ABC_OPER_ARI_MIN;      // 50: arithmetic minus
    if ( Type == WLC_OBJ_ARI_SQRT )       return ABC_OPER_ARI_SQRT;     // 51: integer square root
    if ( Type == WLC_OBJ_ARI_SQUARE )     return ABC_OPER_ARI_SQUARE;   // 52: integer square
    if ( Type == WLC_OBJ_ARI_ADDSUB )     return ABC_OPER_ARI_ADDSUB;   // 56: adder-subtractor
    if ( Type == WLC_OBJ_ARI_MULTI )      return ABC_OPER_ARI_SMUL;     // 45: signed multiplier
    if ( Type == WLC_OBJ_FO )             return ABC_OPER_DFFRSE;       // 03: flop
    if ( Type == WLC_OBJ_FF )             return ABC_OPER_DFFRSE;       // 05: flop
    if ( Type == WLC_OBJ_READ )           return ABC_OPER_RAMR;         // 54: read port
    if ( Type == WLC_OBJ_WRITE )          return ABC_OPER_RAMW;         // 55: write port
    if ( Type == WLC_OBJ_LUT )            return ABC_OPER_LUT;          // 59: LUT
    return -1;
}